

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall QHeaderView::mouseDoubleClickEvent(QHeaderView *this,QMouseEvent *e)

{
  Orientation OVar1;
  QHeaderViewPrivate *this_00;
  double dVar2;
  ResizeMode RVar3;
  int iVar4;
  long in_FS_OFFSET;
  double dVar5;
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  int local_4c;
  QCursor local_48;
  int *piStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  OVar1 = this_00->orientation;
  dVar5 = (double)QEventPoint::position();
  if (OVar1 != Horizontal) {
    dVar5 = extraout_XMM1_Qa;
  }
  dVar5 = (double)(((ulong)dVar5 >> 0x20 & 0x80000000) << 0x20 | (ulong)DAT_0066f5c0) + dVar5;
  dVar2 = 2147483647.0;
  if (dVar5 <= 2147483647.0) {
    dVar2 = dVar5;
  }
  if (dVar2 <= -2147483648.0) {
    dVar2 = -2147483648.0;
  }
  local_4c = QHeaderViewPrivate::sectionHandleAt(this_00,(int)dVar2);
  if (-1 < local_4c) {
    RVar3 = sectionResizeMode(this,local_4c);
    if (RVar3 == Interactive) {
      piStack_40 = &local_4c;
      local_48.d = (QCursorData *)0x0;
      QMetaObject::activate((QObject *)this,&staticMetaObject,7,&local_48.d);
      OVar1 = this_00->orientation;
      QWidget::cursor((QWidget *)&local_48);
      iVar4 = QCursor::shape();
      QCursor::~QCursor(&local_48);
      if (iVar4 == (OVar1 == Horizontal) + 0xb) {
        iVar4 = QHeaderViewPrivate::sectionHandleAt(this_00,(int)dVar2);
        if (-1 < iVar4) {
          RVar3 = sectionResizeMode(this,iVar4);
          if (RVar3 == Interactive) goto LAB_0055a289;
        }
        QCursor::QCursor(&local_48,ArrowCursor);
        QWidget::setCursor((QWidget *)this,&local_48);
        QCursor::~QCursor(&local_48);
      }
      goto LAB_0055a289;
    }
  }
  dVar5 = (double)QEventPoint::position();
  if (*(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget.field_0x8 + 0x548) != 1) {
    dVar5 = extraout_XMM1_Qa_00;
  }
  dVar5 = (double)(((ulong)dVar5 >> 0x20 & 0x80000000) << 0x20 | (ulong)DAT_0066f5c0) + dVar5;
  dVar2 = 2147483647.0;
  if (dVar5 <= 2147483647.0) {
    dVar2 = dVar5;
  }
  if (dVar2 <= -2147483648.0) {
    dVar2 = -2147483648.0;
  }
  local_4c = logicalIndexAt(this,(int)dVar2);
  piStack_40 = &local_4c;
  local_48.d = (QCursorData *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,5,&local_48.d);
LAB_0055a289:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderView::mouseDoubleClickEvent(QMouseEvent *e)
{
    Q_D(QHeaderView);
    int pos = d->orientation == Qt::Horizontal ? e->position().toPoint().x() : e->position().toPoint().y();
    int handle = d->sectionHandleAt(pos);
    if (handle > -1 && sectionResizeMode(handle) == Interactive) {
        emit sectionHandleDoubleClicked(handle);
#ifndef QT_NO_CURSOR
        Qt::CursorShape splitCursor = (d->orientation == Qt::Horizontal)
                                      ? Qt::SplitHCursor : Qt::SplitVCursor;
        if (cursor().shape() == splitCursor) {
            // signal handlers may have changed the section size
            handle = d->sectionHandleAt(pos);
            if (!(handle > -1 && sectionResizeMode(handle) == Interactive))
                setCursor(Qt::ArrowCursor);
        }
#endif
    } else {
        emit sectionDoubleClicked(logicalIndexAt(e->position().toPoint()));
    }
}